

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doUnion
                 (IVal *__return_storage_ptr__,IVal *a,IVal *b)

{
  Interval *pIVar1;
  Interval *b_00;
  IVal local_40;
  int local_24;
  IVal *pIStack_20;
  int ndx;
  IVal *b_local;
  IVal *a_local;
  IVal *ret;
  
  pIStack_20 = b;
  b_local = a;
  a_local = __return_storage_ptr__;
  tcu::Vector<tcu::Interval,_3>::Vector(__return_storage_ptr__);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    pIVar1 = tcu::Vector<tcu::Interval,_3>::operator[](b_local,local_24);
    b_00 = tcu::Vector<tcu::Interval,_3>::operator[](pIStack_20,local_24);
    unionIVal<float>(&local_40,pIVar1,b_00);
    pIVar1 = tcu::Vector<tcu::Interval,_3>::operator[](__return_storage_ptr__,local_24);
    pIVar1->m_hasNaN = local_40.m_hasNaN;
    *(undefined7 *)&pIVar1->field_0x1 = local_40._1_7_;
    pIVar1->m_lo = local_40.m_lo;
    pIVar1->m_hi = local_40.m_hi;
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doUnion			(const IVal& a, const IVal& b)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = unionIVal<Element>(a[ndx], b[ndx]);

		return ret;
	}